

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,size_t pos,
          ArrayPtr<const_unsigned_char> *params)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint uVar6;
  size_t sVar7;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  ArrayPtr<const_unsigned_char> *in_R9;
  HashBucket *_s944;
  HashBucket *pHVar8;
  HashBucket *pHVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::_::HashSetCallbacks> *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    rehash(this_00,pos * 3 + 3);
  }
  uVar3 = hashCode<kj::ArrayPtr<unsigned_char_const>&>((StringPtr *)in_R9);
  sVar4 = (this_00->buckets).size_;
  uVar6 = (int)sVar4 - 1U & uVar3;
  pHVar8 = (HashBucket *)0x0;
  aVar5 = extraout_RDX;
  do {
    pHVar9 = (this_00->buckets).ptr + uVar6;
    uVar1 = pHVar9->value;
    if (uVar1 == 1) {
      if (pHVar8 == (HashBucket *)0x0) {
        pHVar8 = pHVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar8 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar9 = pHVar8;
        }
        *pHVar9 = (HashBucket)(((ulong)uVar3 | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
LAB_0030bbf9:
        MVar10.ptr.field_1.value = aVar5.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
      if (pHVar9->hash == uVar3) {
        bVar2 = ArrayPtr<const_unsigned_char>::operator==
                          ((ArrayPtr<const_unsigned_char> *)
                           ((ulong)(uVar1 - 2) * 0x10 + table.size_),in_R9);
        aVar5 = extraout_RDX_00;
        if (bVar2) {
          uVar3 = pHVar9->value;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar3 - 2);
          goto LAB_0030bbf9;
        }
        sVar4 = (this_00->buckets).size_;
      }
    }
    sVar7 = (ulong)uVar6 + 1;
    uVar6 = (uint)sVar7;
    if (sVar7 == sVar4) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }